

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestCRLF::Run(ParserTestCRLF *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  ManifestParser parser;
  State local_state;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  ManifestParser local_178;
  State local_118;
  
  State::State(&local_118);
  ManifestParser::ManifestParser(&local_178,&local_118,(FileReader *)0x0,(ManifestParserOptions)0x0)
  ;
  pTVar1 = g_current_test;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"# comment with crlf\r\n",&local_1b9);
  bVar2 = ManifestParser::ParseTest(&local_178,&local_1b8,&local_198);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x437,"parser.ParseTest(\"# comment with crlf\\r\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_1b8);
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"foo = foo\nbar = bar\r\n",&local_1b9);
  bVar2 = ManifestParser::ParseTest(&local_178,&local_1b8,&local_198);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x438,"parser.ParseTest(\"foo = foo\\nbar = bar\\r\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_1b8);
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "pool link_pool\r\n  depth = 15\r\n\r\nrule xyz\r\n  command = something$expand \r\n  description = YAY!\r\n"
             ,&local_1b9);
  bVar2 = ManifestParser::ParseTest(&local_178,&local_1b8,&local_198);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x43f,
             "parser.ParseTest( \"pool link_pool\\r\\n\" \"  depth = 15\\r\\n\\r\\n\" \"rule xyz\\r\\n\" \"  command = something$expand \\r\\n\" \"  description = YAY!\\r\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  State::~State(&local_118);
  return;
}

Assistant:

TEST_F(ParserTest, CRLF) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;

  EXPECT_TRUE(parser.ParseTest("# comment with crlf\r\n", &err));
  EXPECT_TRUE(parser.ParseTest("foo = foo\nbar = bar\r\n", &err));
  EXPECT_TRUE(parser.ParseTest(
      "pool link_pool\r\n"
      "  depth = 15\r\n\r\n"
      "rule xyz\r\n"
      "  command = something$expand \r\n"
      "  description = YAY!\r\n",
      &err));
}